

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Name __thiscall wasm::MultiMemoryLowering::getOffsetGlobal(MultiMemoryLowering *this,Index idx)

{
  IString IVar1;
  reference pvVar2;
  Index idx_local;
  MultiMemoryLowering *this_local;
  char *local_10;
  
  if (idx == 0) {
    wasm::Name::Name((Name *)&this_local);
  }
  else {
    pvVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                       (&this->offsetGlobalNames,(ulong)(idx - 1));
    this_local = (MultiMemoryLowering *)(pvVar2->super_IString).str._M_len;
    local_10 = (pvVar2->super_IString).str._M_str;
  }
  IVar1.str._M_str = local_10;
  IVar1.str._M_len = (size_t)this_local;
  return (IString)(IString)IVar1.str;
}

Assistant:

Name getOffsetGlobal(Index idx) {
    // There is no offset global for the first memory
    if (idx == 0) {
      return Name();
    }

    // Since there is no offset global for the first memory, we need to
    // subtract one when indexing into the offsetGlobalName vector
    return offsetGlobalNames[idx - 1];
  }